

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O2

string_t __thiscall
duckdb::SubstringGrapheme(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  char *pcVar1;
  bool bVar2;
  size_t input_size;
  ulong uVar3;
  ulong uVar4;
  char *input_data;
  ulong uVar5;
  long lVar6;
  GraphemeCluster GVar7;
  anon_union_16_2_67f50693_for_value aVar8;
  long local_b8;
  int64_t start;
  Vector *local_a8;
  int64_t end;
  ulong local_98;
  GraphemeIterator local_90;
  string_t input_local;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  
  lVar6 = input.value._8_8_;
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  input_data = input_local.value.pointer.ptr;
  if ((uint)result < 0xd) {
    input_data = input_local.value.pointer.prefix;
  }
  uVar5 = (ulong)result & 0xffffffff;
  input_local.value._0_8_ = result;
  AssertInSupportedRange(uVar5,lVar6,offset);
  bVar2 = SubstringStartEnd(uVar5,lVar6,offset,&start,&end);
  if (!bVar2) {
    aVar8.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
  }
  local_b8 = end;
  uVar4 = end + 1U;
  if (uVar5 <= end + 1U) {
    uVar4 = uVar5;
  }
  uVar3 = 0;
  do {
    if (uVar4 == uVar3) {
      lVar6 = end - start;
      goto LAB_0184e329;
    }
    pcVar1 = input_data + uVar3;
    uVar3 = uVar3 + 1;
  } while (-1 < *pcVar1);
  local_a8 = (Vector *)this;
  if (lVar6 < 0) {
    input_size = Utf8Proc::GraphemeCount(input_data,uVar5);
    SubstringStartEnd(input_size,lVar6,offset,&start,&end);
    local_b8 = end;
  }
  local_98 = uVar5;
  local_90 = Utf8Proc::GraphemeClusters(input_data,uVar5);
  GraphemeIterator::begin(&__begin1,&local_90);
  GraphemeIterator::end(&__end1,&local_90);
  lVar6 = 0;
  uVar5 = 0xffffffffffffffff;
  while (bVar2 = GraphemeIterator::GraphemeClusterIterator::operator!=(&__begin1,&__end1),
        uVar4 = local_98, bVar2) {
    GVar7 = GraphemeIterator::GraphemeClusterIterator::operator*(&__begin1);
    uVar3 = GVar7.start;
    if ((start != lVar6) && (uVar4 = uVar3, uVar3 = uVar5, local_b8 == lVar6)) break;
    lVar6 = lVar6 + 1;
    GraphemeIterator::GraphemeClusterIterator::operator++(&__begin1);
    uVar5 = uVar3;
  }
  if (uVar5 == 0xffffffffffffffff) {
    aVar8.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString(local_a8);
  }
  else {
    lVar6 = uVar4 - uVar5;
    start = uVar5;
    this = (duckdb *)local_a8;
LAB_0184e329:
    aVar8.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         SubstringSlice((Vector *)this,input_data,start,lVar6);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
}

Assistant:

string_t SubstringGrapheme(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	// we don't know yet if the substring is ascii, but we assume it is (for now)
	// first get the start and end as if this was an ascii string
	int64_t start, end;
	if (!SubstringStartEnd(UnsafeNumericCast<int64_t>(input_size), offset, length, start, end)) {
		return SubstringEmptyString(result);
	}

	// now check if all the characters between 0 and end are ascii characters
	// note that we scan one further to check for a potential combining diacritics (e.g. i + diacritic is ï)
	bool is_ascii = true;
	idx_t ascii_end = MinValue<idx_t>(UnsafeNumericCast<idx_t>(end + 1), input_size);
	for (idx_t i = 0; i < ascii_end; i++) {
		if (input_data[i] & 0x80) {
			// found a non-ascii character: eek
			is_ascii = false;
			break;
		}
	}
	if (is_ascii) {
		// all characters are ascii, we can just slice the substring
		return SubstringSlice(result, input_data, start, end - start);
	}
	// if the characters are not ascii, we need to scan grapheme clusters
	// first figure out which direction we need to scan
	// offset = 0 case is taken care of in SubstringStartEnd
	if (offset < 0) {
		// negative offset, this case is more difficult
		// we first need to count the number of characters in the string
		idx_t num_characters = Utf8Proc::GraphemeCount(input_data, input_size);
		// now call substring start and end again, but with the number of unicode characters this time
		SubstringStartEnd(UnsafeNumericCast<int64_t>(num_characters), offset, length, start, end);
	}

	// now scan the graphemes of the string to find the positions of the start and end characters
	int64_t current_character = 0;
	idx_t start_pos = DConstants::INVALID_INDEX, end_pos = input_size;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		if (current_character == start) {
			start_pos = cluster.start;
		} else if (current_character == end) {
			end_pos = cluster.start;
			break;
		}
		current_character++;
	}
	if (start_pos == DConstants::INVALID_INDEX) {
		return SubstringEmptyString(result);
	}
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}